

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

string * __thiscall
cmState::GetSafeCacheEntryValue(string *__return_storage_ptr__,cmState *this,string *key)

{
  cmValue cVar1;
  
  cVar1 = GetCacheEntryValue(this,key);
  if (cVar1.Value == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar1.Value);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::GetSafeCacheEntryValue(std::string const& key) const
{
  if (cmValue val = this->GetCacheEntryValue(key)) {
    return *val;
  }
  return std::string();
}